

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

bool __thiscall soplex::SPxSolverBase<double>::noViols(SPxSolverBase<double> *this,double tol)

{
  double *pdVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  double dVar8;
  
  iVar2 = (this->thecovectors->set).thenum;
  uVar5 = (ulong)iVar2;
  bVar6 = 0 < (long)uVar5;
  if (this->theType == ENTER) {
    if (iVar2 < 1) {
      return true;
    }
    pdVar3 = (this->theFvec->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar8 = *pdVar3;
    if (dVar8 - *pdVar4 <= tol) {
      uVar7 = 1;
      do {
        if (tol < (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar7 - 1] - dVar8) break;
        if (uVar5 == uVar7) {
          return true;
        }
        bVar6 = uVar7 < uVar5;
        dVar8 = pdVar3[uVar7];
        pdVar1 = pdVar4 + uVar7;
        uVar7 = uVar7 + 1;
      } while (dVar8 - *pdVar1 <= tol);
    }
  }
  else {
    if (0 < iVar2) {
      pdVar3 = (this->theCoPvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (this->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar8 = *pdVar3;
      if (dVar8 - *pdVar4 <= tol) {
        uVar7 = 1;
        do {
          if (tol < (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7 - 1] - dVar8) break;
          if (uVar5 == uVar7) goto LAB_001bf1ff;
          bVar6 = uVar7 < uVar5;
          dVar8 = pdVar3[uVar7];
          pdVar1 = pdVar4 + uVar7;
          uVar7 = uVar7 + 1;
        } while (dVar8 - *pdVar1 <= tol);
      }
      if (bVar6) {
        return false;
      }
    }
LAB_001bf1ff:
    uVar5 = (ulong)(this->thevectors->set).thenum;
    bVar6 = 0 < (long)uVar5;
    if ((long)uVar5 < 1) {
      return true;
    }
    pdVar3 = (this->thePvec->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4 = (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar8 = *pdVar3;
    if (dVar8 - *pdVar4 <= tol) {
      uVar7 = 1;
      do {
        if (tol < (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar7 - 1] - dVar8) break;
        if (uVar5 == uVar7) {
          return true;
        }
        bVar6 = uVar7 < uVar5;
        dVar8 = pdVar3[uVar7];
        pdVar1 = pdVar4 + uVar7;
        uVar7 = uVar7 + 1;
      } while (dVar8 - *pdVar1 <= tol);
    }
  }
  if (!bVar6) {
    return true;
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::noViols(R tol) const
   {
      assert(tol >= R(0.0));

      if(type() == ENTER)
      {
         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] - theUBbound[i] > tol)
               return false;

            if(theLBbound[i] - (*theFvec)[i] > tol)
               return false;
         }
      }
      else
      {
         assert(type() == LEAVE);

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] - (*theCoUbound)[i] > tol)
               return false;

            if((*theCoLbound)[i] - (*theCoPvec)[i] > tol)
               return false;
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] - (*theUbound)[i] > tol)
               return false;

            if((*theLbound)[i] - (*thePvec)[i] > tol)
               return false;
         }
      }

      return true;
   }